

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O2

TextureFormat glu::mapGLInternalFormat(deUint32 internalFormat)

{
  ulong uVar1;
  InternalError *this;
  ulong uStack_b0;
  allocator<char> local_a1;
  ulong local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(internalFormat) {
  case 0x8229:
    uVar1 = 0x300000000;
    break;
  case 0x822a:
    uVar1 = 0x400000000;
    break;
  case 0x822b:
    uStack_b0 = 5;
    goto switchD_0026e1f3_caseD_8058;
  case 0x822c:
    uStack_b0 = 5;
    goto switchD_0026e1f3_caseD_805b;
  case 0x822d:
    uVar1 = 0x2200000000;
    break;
  case 0x822e:
    uVar1 = 0x2300000000;
    break;
  case 0x822f:
    uStack_b0 = 5;
    goto switchD_0026e238_caseD_881a;
  case 0x8230:
    uStack_b0 = 5;
    goto switchD_0026e238_caseD_8814;
  case 0x8231:
    uVar1 = 0x1b00000000;
    break;
  case 0x8232:
    uVar1 = 0x1e00000000;
    break;
  case 0x8233:
    uVar1 = 0x1c00000000;
    break;
  case 0x8234:
    uVar1 = 0x1f00000000;
    break;
  case 0x8235:
    uVar1 = 0x1d00000000;
    break;
  case 0x8236:
    uVar1 = 0x2100000000;
    break;
  case 0x8237:
    uStack_b0 = 5;
    goto switchD_0026e271_caseD_8d8e;
  case 0x8238:
    uStack_b0 = 5;
    goto switchD_0026e20a_caseD_8d7c;
  case 0x8239:
    uStack_b0 = 5;
    goto switchD_0026e271_caseD_8d88;
  case 0x823a:
    uStack_b0 = 5;
    goto switchD_0026e20a_caseD_8d76;
  case 0x823b:
    uStack_b0 = 5;
    goto switchD_0026e20a_caseD_8d82;
  case 0x823c:
    uStack_b0 = 5;
    goto switchD_0026e20a_caseD_8d70;
  default:
    uStack_b0 = 8;
    switch(internalFormat) {
    case 0x8051:
      uStack_b0 = 7;
    case 0x8058:
switchD_0026e1f3_caseD_8058:
      uVar1 = 0x300000000;
      goto LAB_0026e481;
    case 0x8052:
      uStack_b0 = 7;
    case 0x8059:
      uVar1 = 0xf00000000;
      goto LAB_0026e481;
    case 0x8053:
    case 0x8055:
    case 0x805a:
switchD_0026e271_caseD_8d8a:
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Can\'t map GL sized internal format (",&local_a1);
      local_a0 = (ulong)internalFormat;
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_98,&local_a0);
      std::operator+(&local_58,&local_78,&local_98);
      std::operator+(&local_38,&local_58,") to texture format");
      tcu::InternalError::InternalError(this,&local_38);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    case 0x8054:
      uStack_b0 = 7;
    case 0x805b:
switchD_0026e1f3_caseD_805b:
      uVar1 = 0x400000000;
      goto LAB_0026e481;
    case 0x8056:
      uVar1 = 0xa00000000;
      goto LAB_0026e481;
    case 0x8057:
      uVar1 = 0xb00000000;
      goto LAB_0026e481;
    default:
      switch(internalFormat) {
      case 0x8d70:
        goto switchD_0026e20a_caseD_8d70;
      case 0x8d71:
        uStack_b0 = 7;
        goto switchD_0026e20a_caseD_8d70;
      case 0x8d72:
      case 0x8d73:
      case 0x8d74:
      case 0x8d75:
      case 0x8d78:
      case 0x8d79:
      case 0x8d7a:
      case 0x8d7b:
      case 0x8d7e:
      case 0x8d7f:
      case 0x8d80:
      case 0x8d81:
        goto switchD_0026e271_caseD_8d8a;
      case 0x8d76:
        goto switchD_0026e20a_caseD_8d76;
      case 0x8d77:
        uStack_b0 = 7;
        goto switchD_0026e20a_caseD_8d76;
      case 0x8d7c:
        goto switchD_0026e20a_caseD_8d7c;
      case 0x8d7d:
        uStack_b0 = 7;
        goto switchD_0026e20a_caseD_8d7c;
      case 0x8d82:
        goto switchD_0026e20a_caseD_8d82;
      case 0x8d83:
        uStack_b0 = 7;
        goto switchD_0026e20a_caseD_8d82;
      }
    }
    switch(internalFormat) {
    case 0x8f94:
      uVar1 = 0;
      goto LAB_0026e3ea;
    case 0x8f95:
      uStack_b0 = 5;
      break;
    case 0x8f96:
      uStack_b0 = 7;
      break;
    case 0x8f97:
      break;
    case 0x8f98:
      uVar1 = 0x100000000;
      goto LAB_0026e3ea;
    case 0x8f99:
      uStack_b0 = 5;
    case 0x8f9b:
switchD_0026e221_caseD_8f9b:
      uVar1 = 0x100000000;
      goto LAB_0026e481;
    case 0x8f9a:
      uStack_b0 = 7;
      goto switchD_0026e221_caseD_8f9b;
    default:
      switch(internalFormat) {
      case 0x8815:
        uStack_b0 = 7;
      case 0x8814:
switchD_0026e238_caseD_8814:
        uVar1 = 0x2300000000;
        break;
      case 0x8816:
      case 0x8817:
      case 0x8818:
      case 0x8819:
        goto switchD_0026e271_caseD_8d8a;
      case 0x881b:
        uStack_b0 = 7;
      case 0x881a:
switchD_0026e238_caseD_881a:
        uVar1 = 0x2200000000;
        break;
      default:
        switch(internalFormat) {
        case 0x8c3a:
          uStack_b0 = 7;
          uVar1 = 0x1600000000;
          goto LAB_0026e481;
        case 0x8c3b:
        case 0x8c3c:
        case 0x8c3e:
        case 0x8c3f:
        case 0x8c40:
        case 0x8c42:
          goto switchD_0026e271_caseD_8d8a;
        case 0x8c3d:
          uStack_b0 = 7;
          uVar1 = 0x1700000000;
          goto LAB_0026e481;
        case 0x8c41:
          uStack_b0 = 0xe;
          break;
        case 0x8c43:
          uStack_b0 = 0xf;
          break;
        default:
          switch(internalFormat) {
          case 0x8d89:
            uStack_b0 = 7;
          case 0x8d88:
switchD_0026e271_caseD_8d88:
            uVar1 = 0x1c00000000;
            break;
          case 0x8d8a:
          case 0x8d8b:
          case 0x8d8c:
          case 0x8d8d:
            goto switchD_0026e271_caseD_8d8a;
          case 0x8d8f:
            uStack_b0 = 7;
          case 0x8d8e:
switchD_0026e271_caseD_8d8e:
            uVar1 = 0x1b00000000;
            break;
          default:
            if (internalFormat == 0x81a5) {
              uStack_b0 = 0x12;
              goto switchD_0026e1f3_caseD_805b;
            }
            if (internalFormat == 0x81a6) {
              uStack_b0 = 0x12;
            }
            else {
              if (internalFormat == 0x81a7) {
                uStack_b0 = 0x12;
                goto switchD_0026e20a_caseD_8d70;
              }
              if (internalFormat != 0x88f0) {
                if (internalFormat == 0x8cac) {
                  uStack_b0 = 0x12;
                  goto switchD_0026e238_caseD_8814;
                }
                if (internalFormat == 0x8cad) {
                  uStack_b0 = 0x14;
                  uVar1 = 0x2500000000;
                  break;
                }
                if (internalFormat == 0x8d48) {
                  uStack_b0 = 0x13;
                  goto switchD_0026e20a_caseD_8d7c;
                }
                if (internalFormat == 0x8d62) {
                  uStack_b0 = 7;
                  uVar1 = 0x800000000;
                  break;
                }
                if (internalFormat == 0x8fbd) {
                  uStack_b0 = 0xc;
                }
                else {
                  if (internalFormat != 0x8fbe) {
                    if (internalFormat != 0x906f) goto switchD_0026e271_caseD_8d8a;
                    uVar1 = 0x1500000000;
                    break;
                  }
                  uStack_b0 = 0xd;
                }
                goto switchD_0026e1f3_caseD_8058;
              }
              uStack_b0 = 0x14;
            }
            uVar1 = 0x1900000000;
          }
          goto LAB_0026e481;
        }
        goto switchD_0026e1f3_caseD_8058;
      }
      goto LAB_0026e481;
    }
    uVar1 = 0;
    goto LAB_0026e481;
  }
LAB_0026e3ea:
  uStack_b0 = 0;
LAB_0026e481:
  return (TextureFormat)(uVar1 | uStack_b0);
switchD_0026e20a_caseD_8d70:
  uVar1 = 0x2100000000;
  goto LAB_0026e481;
switchD_0026e20a_caseD_8d82:
  uVar1 = 0x1d00000000;
  goto LAB_0026e481;
switchD_0026e20a_caseD_8d76:
  uVar1 = 0x1f00000000;
  goto LAB_0026e481;
switchD_0026e20a_caseD_8d7c:
  uVar1 = 0x1e00000000;
  goto LAB_0026e481;
}

Assistant:

tcu::TextureFormat mapGLInternalFormat (deUint32 internalFormat)
{
	using tcu::TextureFormat;
	switch (internalFormat)
	{
		case GL_RGB5_A1:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_5551);
		case GL_RGBA4:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_4444);
		case GL_RGB565:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_SHORT_565);
		case GL_DEPTH_COMPONENT16:	return TextureFormat(TextureFormat::D,		TextureFormat::UNORM_INT16);
		case GL_STENCIL_INDEX8:		return TextureFormat(TextureFormat::S,		TextureFormat::UNSIGNED_INT8);

		case GL_RGBA32F:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT);
		case GL_RGBA32I:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT32);
		case GL_RGBA32UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT32);
		case GL_RGBA16:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT16);
		case GL_RGBA16_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT16);
		case GL_RGBA16F:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::HALF_FLOAT);
		case GL_RGBA16I:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case GL_RGBA16UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case GL_RGBA8:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case GL_RGBA8I:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case GL_RGBA8UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case GL_SRGB8_ALPHA8:		return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);
		case GL_RGB10_A2:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT_1010102_REV);
		case GL_RGB10_A2UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case GL_RGBA8_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);

		case GL_RGB8:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_R11F_G11F_B10F:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_11F_11F_10F_REV);
		case GL_RGB32F:				return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT);
		case GL_RGB32I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT32);
		case GL_RGB32UI:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT32);
		case GL_RGB16:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT16);
		case GL_RGB16_SNORM:		return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT16);
		case GL_RGB16F:				return TextureFormat(TextureFormat::RGB,	TextureFormat::HALF_FLOAT);
		case GL_RGB16I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case GL_RGB16UI:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case GL_RGB8_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT8);
		case GL_RGB8I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case GL_RGB8UI:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case GL_SRGB8:				return TextureFormat(TextureFormat::sRGB,	TextureFormat::UNORM_INT8);
		case GL_RGB9_E5:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_999_E5_REV);
		case GL_RGB10:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT_1010102_REV);

		case GL_RG32F:				return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT);
		case GL_RG32I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT32);
		case GL_RG32UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT32);
		case GL_RG16:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT16);
		case GL_RG16_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT16);
		case GL_RG16F:				return TextureFormat(TextureFormat::RG,		TextureFormat::HALF_FLOAT);
		case GL_RG16I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case GL_RG16UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case GL_RG8:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT8);
		case GL_RG8I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case GL_RG8UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case GL_RG8_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT8);
		case GL_SRG8_EXT:			return TextureFormat(TextureFormat::sRG,	TextureFormat::UNORM_INT8);

		case GL_R32F:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT);
		case GL_R32I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT32);
		case GL_R32UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT32);
		case GL_R16:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT16);
		case GL_R16_SNORM:			return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT16);
		case GL_R16F:				return TextureFormat(TextureFormat::R,		TextureFormat::HALF_FLOAT);
		case GL_R16I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case GL_R16UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case GL_R8:					return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT8);
		case GL_R8I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case GL_R8UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case GL_R8_SNORM:			return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT8);
		case GL_SR8_EXT:			return TextureFormat(TextureFormat::sR,		TextureFormat::UNORM_INT8);

		case GL_DEPTH_COMPONENT32F:	return TextureFormat(TextureFormat::D,		TextureFormat::FLOAT);
		case GL_DEPTH_COMPONENT24:	return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT_24_8);
		case GL_DEPTH_COMPONENT32:	return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT32);
		case GL_DEPTH32F_STENCIL8:	return TextureFormat(TextureFormat::DS,		TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV);
		case GL_DEPTH24_STENCIL8:	return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_24_8);

		default:
			throw tcu::InternalError(string("Can't map GL sized internal format (") + tcu::toHex(internalFormat).toString() + ") to texture format");
	}
}